

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeader.cpp
# Opt level: O2

string * __thiscall
BamTools::SamHeader::GetErrorString_abi_cxx11_(string *__return_storage_ptr__,SamHeader *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_errorString);
  return __return_storage_ptr__;
}

Assistant:

std::string SamHeader::GetErrorString() const
{
    return m_errorString;
}